

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void PrintEnum(FLispString *out,ZCC_TreeNode *node)

{
  char *str;
  FName local_14;
  
  FLispString::Break(out);
  FLispString::Open(out,"enum");
  FLispString::AddName(out,&local_14);
  PrintBuiltInType(out,*(EZCCBuiltinType *)((long)&node[1].SiblingNext + 4));
  str = "...";
  if (node[1].SiblingPrev == (ZCC_TreeNode *)0x0) {
    str = "nil";
  }
  FLispString::Add(out,str,3);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintEnum(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_Enum *enode = (ZCC_Enum *)node;
	out.Break();
	out.Open("enum");
	out.AddName(enode->NodeName);
	PrintBuiltInType(out, enode->EnumType);
	out.Add(enode->Elements == NULL ? "nil" : "...", 3);
	out.Close();
}